

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  ImDrawList *pIVar1;
  bool bVar2;
  char *pcVar3;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_c4;
  bool local_bd;
  float local_bc;
  float local_b8;
  ImVec2 local_b4;
  ImVec2 local_ac;
  float local_a4;
  float border_y;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  float local_80;
  undefined1 auStack_7c [4];
  ImU32 outer_col;
  ImRect outer_border;
  ImVec2 local_64;
  float local_5c;
  float local_58;
  float draw_y2;
  ImU32 col;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImDrawList *outer_drawlist;
  ImDrawList *inner_drawlist;
  ImGuiWindow *outer_window;
  ImGuiWindow *inner_window;
  ImGuiTable *table_local;
  
  outer_window = table->InnerWindow;
  inner_drawlist = (ImDrawList *)table->OuterWindow;
  inner_window = (ImGuiWindow *)table;
  ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,outer_window->DrawList,0);
  if (((outer_window->Hidden & 1U) == 0) &&
     (bVar2 = ImRect::Overlaps((ImRect *)&(inner_window->DC).CursorStartPos.y,
                               (ImRect *)&inner_window->SetWindowPosPivot), bVar2)) {
    outer_drawlist = outer_window->DrawList;
    _draw_y1 = (ImDrawList *)inner_drawlist[3]._Splitter._Channels.Data;
    draw_y2_body = 1.0;
    draw_y2_head = (float)inner_window->HiddenFramesCannotSkipItems;
    order_n = inner_window->SetWindowSizeAllowFlags;
    local_bc = draw_y2_head;
    if (((inner_window->DC).CurrentTableIdx & 0x1000000) != 0) {
      if (*(char *)&(inner_window->DC).CurrentColumns < '\x01') {
        local_b8 = (float)inner_window->SetWindowDockAllowFlags;
      }
      else {
        local_b8 = (float)inner_window->HiddenFramesCannotSkipItems;
      }
      local_bc = local_b8 + *(float *)&inner_window->SkipItems;
    }
    column_n = (int)local_bc;
    if (((ulong)inner_window->Name & 0x40000000000) != 0) {
      for (column._4_4_ = 0; column._4_4_ < (int)(inner_window->ContentSize).y;
          column._4_4_ = column._4_4_ + 1) {
        if (((ulong)inner_window->Pos & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
          pcVar3 = ImSpan<signed_char>::operator[]
                             ((ImSpan<signed_char> *)
                              &(inner_window->WindowClass).ViewportFlagsOverrideClear,column._4_4_);
          column._0_4_ = (int)*pcVar3;
          _col = ImSpan<ImGuiTableColumn>::operator[]
                           ((ImSpan<ImGuiTableColumn> *)&inner_window->FlagsPreviousFrame,
                            (int)column);
          draw_y2._3_1_ = *(char *)((long)&(inner_window->DC).ChildWindows.Data + 5) == (int)column;
          local_bd = false;
          if (*(char *)((long)&(inner_window->DC).ChildWindows.Data + 7) == (int)column) {
            local_bd = *(short *)((long)&(inner_window->WindowPadding).x + 2) ==
                       *(short *)&(inner_window->WindowPadding).x;
          }
          draw_y2._2_1_ = local_bd;
          draw_y2._1_1_ = (_col->Flags & 0x40000020U) == 0;
          if ((((_col->MaxX < *(float *)&inner_window->field_0x104 ||
                 _col->MaxX == *(float *)&inner_window->field_0x104) || (local_bd != false)) &&
              ((_col->NextVisibleColumn != -1 || ((bool)draw_y2._1_1_)))) &&
             ((_col->ClipRect).Min.x < _col->MaxX)) {
            if ((((bool)draw_y2._3_1_) || (local_bd != false)) ||
               ((*(char *)((long)&(inner_window->DC).CurrentColumns + 2) != -1 &&
                ((int)*(char *)((long)&(inner_window->DC).CurrentColumns + 2) == column._4_4_ + 1)))
               ) {
              local_5c = (float)order_n;
              if (local_bd == false) {
                if ((bool)draw_y2._3_1_) {
                  local_c8 = (float)GetColorU32(0x1c,1.0);
                }
                else {
                  local_c8 = (inner_window->ScrollMax).y;
                }
                local_c4 = local_c8;
              }
              else {
                local_c4 = (float)GetColorU32(0x1d,1.0);
              }
              local_58 = local_c4;
            }
            else {
              if (((ulong)inner_window->Name & 0x300000000000) == 0) {
                local_cc = (float)order_n;
              }
              else {
                local_cc = (float)column_n;
              }
              local_5c = local_cc;
              if (((ulong)inner_window->Name & 0x300000000000) == 0) {
                local_d0 = (inner_window->ScrollTarget).x;
              }
              else {
                local_d0 = (inner_window->ScrollMax).y;
              }
              local_58 = local_d0;
            }
            pIVar1 = outer_drawlist;
            if (draw_y2_head < local_5c) {
              ImVec2::ImVec2(&local_64,_col->MaxX,draw_y2_head);
              ImVec2::ImVec2(&outer_border.Max,_col->MaxX,local_5c);
              ImDrawList::AddLine(pIVar1,&local_64,&outer_border.Max,(ImU32)local_58,1.0);
            }
          }
        }
      }
    }
    if (((ulong)inner_window->Name & 0xa0000000000) != 0) {
      auStack_7c = (undefined1  [4])inner_window->HiddenFramesCanSkipItems;
      outer_col = inner_window->HiddenFramesCannotSkipItems;
      outer_border.Min.x = (float)inner_window->SetWindowPosAllowFlags;
      outer_border.Min.y = (float)inner_window->SetWindowSizeAllowFlags;
      local_80 = (inner_window->ScrollMax).y;
      if (outer_window != (ImGuiWindow *)inner_drawlist) {
        ImRect::Expand((ImRect *)auStack_7c,1.0);
      }
      pIVar1 = _draw_y1;
      if (((ulong)inner_window->Name & 0xa0000000000) == 0xa0000000000) {
        ImDrawList::AddRect(_draw_y1,(ImVec2 *)auStack_7c,&outer_border.Min,(ImU32)local_80,0.0,-1,
                            1.0);
      }
      else if (((ulong)inner_window->Name & 0x80000000000) == 0) {
        if (((ulong)inner_window->Name & 0x20000000000) != 0) {
          ImVec2::ImVec2(&local_98,outer_border.Min.x,(float)outer_col);
          ImDrawList::AddLine(pIVar1,(ImVec2 *)auStack_7c,&local_98,(ImU32)local_80,1.0);
          pIVar1 = _draw_y1;
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff60,(float)auStack_7c,outer_border.Min.y);
          ImDrawList::AddLine(pIVar1,(ImVec2 *)&stack0xffffffffffffff60,&outer_border.Min,
                              (ImU32)local_80,1.0);
        }
      }
      else {
        ImVec2::ImVec2(&local_88,(float)auStack_7c,outer_border.Min.y);
        ImDrawList::AddLine(pIVar1,(ImVec2 *)auStack_7c,&local_88,(ImU32)local_80,1.0);
        pIVar1 = _draw_y1;
        ImVec2::ImVec2(&local_90,outer_border.Min.x,(float)outer_col);
        ImDrawList::AddLine(pIVar1,&local_90,&outer_border.Min,(ImU32)local_80,1.0);
      }
    }
    pIVar1 = outer_drawlist;
    if ((((((ulong)inner_window->Name & 0x10000000000) != 0) &&
         (inner_window->WindowRounding < (float)inner_window->SetWindowSizeAllowFlags)) &&
        (local_a4 = inner_window->WindowRounding,
        *(float *)&(inner_window->IDStack).Data <= local_a4)) &&
       (local_a4 < (inner_window->DC).CursorPos.x)) {
      ImVec2::ImVec2(&local_ac,(inner_window->ScrollTarget).y,local_a4);
      ImVec2::ImVec2(&local_b4,(inner_window->ScrollTargetCenterRatio).x,local_a4);
      ImDrawList::AddLine(pIVar1,&local_ac,&local_b4,(ImU32)(inner_window->ScrollTarget).x,1.0);
    }
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_BG0);
    if (inner_window->Hidden || !table->HostClipRect.Overlaps(table->InnerClipRect))
        return;
    ImDrawList* inner_drawlist = inner_window->DrawList;
    ImDrawList* outer_drawlist = outer_window->DrawList;

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->OuterRect.Min.y;
    const float draw_y2_body = table->OuterRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ((table->FreezeRowsCount >= 1 ? table->OuterRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;

    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;

            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)// && is_hovered)
                continue;
            if (column->NextVisibleColumn == -1 && !is_resizable)
                continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1))
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME-TABLE: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if (inner_window != outer_window) // FIXME-TABLE
            outer_border.Expand(1.0f);
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            outer_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            outer_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            outer_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }
}